

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_psbt.cpp
# Opt level: O2

DescriptorScriptData *
cfd::ParseDescriptor
          (DescriptorScriptData *__return_storage_ptr__,string *descriptor,
          vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *key_list,
          NetType *net_type)

{
  pointer pKVar1;
  char cVar2;
  pointer __x;
  allocator local_3d1;
  undefined8 local_3d0;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> temp_key_list;
  string local_3b0;
  AddressFactory addr_factory;
  DescriptorScriptData local_368;
  
  temp_key_list.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  temp_key_list.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  temp_key_list.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  DescriptorScriptData::DescriptorScriptData(__return_storage_ptr__);
  if (net_type == (NetType *)0x0) {
    local_3d0 = 0;
    AddressFactory::AddressFactory(&addr_factory,kMainnet);
    std::__cxx11::string::string((string *)&local_3b0,"",&local_3d1);
    AddressFactory::ParseOutputDescriptor
              (&local_368,&addr_factory,descriptor,&local_3b0,
               (vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_> *)0x0,
               (vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_> *)0x0,
               &temp_key_list);
    DescriptorScriptData::operator=(__return_storage_ptr__,&local_368);
  }
  else {
    AddressFactory::AddressFactory(&addr_factory,*net_type);
    std::__cxx11::string::string((string *)&local_3b0,"",&local_3d1);
    AddressFactory::ParseOutputDescriptor
              (&local_368,&addr_factory,descriptor,&local_3b0,
               (vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_> *)0x0,
               (vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_> *)0x0,
               &temp_key_list);
    DescriptorScriptData::operator=(__return_storage_ptr__,&local_368);
  }
  DescriptorScriptData::~DescriptorScriptData(&local_368);
  std::__cxx11::string::~string((string *)&local_3b0);
  AddressFactory::~AddressFactory(&addr_factory);
  pKVar1 = temp_key_list.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (key_list != (vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)0x0) {
    for (__x = temp_key_list.
               super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
               super__Vector_impl_data._M_start; __x != pKVar1; __x = __x + 1) {
      cVar2 = cfd::core::KeyData::IsValid();
      if (cVar2 != '\0') {
        cfd::core::KeyData::GetFingerprint();
        cVar2 = cfd::core::ByteData::IsEmpty();
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_368);
        if (cVar2 == '\0') {
          std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::push_back
                    (key_list,__x);
        }
      }
    }
  }
  std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector(&temp_key_list);
  return __return_storage_ptr__;
}

Assistant:

cfd::DescriptorScriptData ParseDescriptor(
    const std::string& descriptor, std::vector<KeyData>* key_list,
    NetType* net_type = nullptr) {
  std::vector<KeyData> temp_key_list;
  cfd::DescriptorScriptData script_data;
  if (net_type == nullptr) {
    NetType target_list[] = {
        NetType::kMainnet, NetType::kTestnet, NetType::kRegtest};
    size_t max = (sizeof(target_list) / sizeof(NetType)) - 1;
    for (size_t index = 0; index <= max; ++index) {
      try {
        cfd::AddressFactory addr_factory(target_list[index]);
        script_data = addr_factory.ParseOutputDescriptor(
            descriptor, "", nullptr, nullptr, &temp_key_list);
        break;
      } catch (const CfdException& except) {
        if (index == max) {
          throw except;
        }
      }
    }
  } else {
    cfd::AddressFactory addr_factory(*net_type);
    script_data = addr_factory.ParseOutputDescriptor(
        descriptor, "", nullptr, nullptr, &temp_key_list);
  }
  if (key_list != nullptr) {
    for (const auto& key : temp_key_list) {
      if (key.IsValid() && (!key.GetFingerprint().IsEmpty())) {
        key_list->push_back(key);
      }
    }
  }
  return script_data;
}